

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::insert
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,
          BindingMap *svBindings,LeafData *ld)

{
  TermList **ppTVar1;
  Node *pNVar2;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *pSVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  IntermediateNode *pIVar7;
  TermList *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node **leaf;
  TermList TVar9;
  ulong uVar10;
  undefined4 extraout_var_02;
  Node *pNVar11;
  TermList *pTVar12;
  Term *t;
  TermList tt;
  Node **inode;
  UnresolvedSplitRecord obj;
  UnresolvedSplitRecord UVar13;
  Binding BVar14;
  Top TVar15;
  Stack<Kernel::TermList_*> subterms;
  TermList term;
  undefined1 local_140 [8];
  VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> local_138;
  uint boundVar;
  uint boundVar_1;
  uint uStack_124;
  Entry *pEStack_120;
  Binding *local_118;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_110;
  SelectedLiteral local_108;
  undefined1 local_d8 [72];
  SelectedLiteral local_90;
  SelectedLiteral local_60;
  undefined4 extraout_var_01;
  
  inode = &this->_root;
  if (this->_root == (Node *)0x0) {
    if (svBindings->_size == 0) {
      pNVar11 = &createLeaf()->super_Node;
      Kernel::SelectedLiteral::SelectedLiteral(&local_60,&ld->super_SelectedLiteral);
      (*((Node *)&pNVar11->_vptr_Node)->_vptr_Node[9])(pNVar11,&local_60);
      *inode = pNVar11;
      return;
    }
    uVar5 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
            getOneKey(svBindings);
    pIVar7 = createIntermediateNode(uVar5);
    *inode = &pIVar7->super_Node;
  }
  if (svBindings->_size == 0) {
    ensureLeafEfficiency((Leaf **)inode);
    pNVar11 = *inode;
    Kernel::SelectedLiteral::SelectedLiteral(&local_90,&ld->super_SelectedLiteral);
    (*pNVar11->_vptr_Node[9])(pNVar11,&local_90);
  }
  else {
    if ((insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::BinaryResolutionConf::Lhs)
         ::unresolvedSplits == '\0') &&
       (iVar6 = __cxa_guard_acquire(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::BinaryResolutionConf::Lhs)
                                     ::unresolvedSplits), iVar6 != 0)) {
      insert::unresolvedSplits._size = 0;
      insert::unresolvedSplits._capacity = 0;
      insert::unresolvedSplits._data = (UnresolvedSplitRecord *)0x0;
      insert::unresolvedSplits._data1 = (UnresolvedSplitRecord *)0x0;
      __cxa_atexit(Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                   ::~BinaryHeap,&insert::unresolvedSplits,&__dso_handle);
      __cxa_guard_release(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::BinaryResolutionConf::Lhs)
                           ::unresolvedSplits);
    }
    insert::unresolvedSplits._0_8_ = insert::unresolvedSplits._0_8_ & 0xffffffff00000000;
    local_110 = this;
LAB_002cb637:
    while ((iVar6 = (*(*inode)->_vptr_Node[2])(), (char)iVar6 == '\0' &&
           (iVar6 = (*(*inode)->_vptr_Node[5])(), iVar6 == 1))) {
      pNVar11 = *inode;
      iVar6 = (*pNVar11->_vptr_Node[4])(pNVar11);
      if (iVar6 != 1) break;
      _boundVar_1 = (Entry *)CONCAT44(uStack_124,*(undefined4 *)&pNVar11[1]._vptr_Node);
      pNVar2 = (Node *)pNVar11[1]._term._content;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::find
                ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 &subterms,&svBindings->_timestamp);
      if (subterms._capacity == 0) {
        TVar9._content = (pNVar2->_term)._content;
        if (((TVar9._content & 3) != 0) || ((*(byte *)(TVar9._content + 0x28) & 8) != 0))
        goto LAB_002cb6f3;
        bVar4 = false;
        goto LAB_002cb730;
      }
      pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                         (svBindings,boundVar_1);
      subterms._capacity = pTVar8->_content;
      TVar15 = Kernel::TermList::top((TermList *)&subterms);
      iVar6 = (*pNVar11->_vptr_Node[10])
                        (pNVar11,TVar15._inner._inner._0_8_,
                         (ulong)(TVar15._inner._inner._8_4_ & 0xff),0);
      if (CONCAT44(extraout_var,iVar6) != 0) {
        bVar4 = true;
        goto LAB_002cb730;
      }
      TVar9._content = (pNVar2->_term)._content;
LAB_002cb6f3:
      UVar13._4_4_ = 0;
      UVar13.var = *(uint *)&pNVar11[1]._vptr_Node;
      UVar13.original._content = TVar9._content;
      Lib::
      BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
      ::insert(&insert::unresolvedSplits,UVar13);
      (pNVar2->_term)._content = (pNVar11->_term)._content;
      *inode = pNVar2;
      (pNVar11->_term)._content = 2;
      (*pNVar11->_vptr_Node[0xc])(pNVar11);
      (*pNVar11->_vptr_Node[1])(pNVar11);
    }
    bVar4 = false;
LAB_002cb730:
    if ((insert::unresolvedSplits._size != 0) && (!bVar4 && insert::unresolvedSplits._size != 0)) {
      do {
        UVar13 = Lib::
                 BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                 ::pop(&insert::unresolvedSplits);
        pNVar11 = *inode;
        pIVar7 = createIntermediateNode((TermList)(pNVar11->_term)._content,UVar13.var);
        (pNVar11->_term)._content = UVar13.original._content._content;
        *inode = &pIVar7->super_Node;
        TVar15 = Kernel::TermList::top(&pNVar11->_term);
        iVar6 = (*(pIVar7->super_Node)._vptr_Node[10])
                          (pIVar7,TVar15._inner._inner._0_8_,
                           (ulong)(TVar15._inner._inner._8_4_ & 0xff),1);
        *(Node **)CONCAT44(extraout_var_00,iVar6) = pNVar11;
      } while (insert::unresolvedSplits._size != 0);
    }
    pNVar11 = *inode;
    boundVar = *(uint *)&pNVar11[1]._vptr_Node;
    pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                       (svBindings,boundVar);
    term._content = pTVar8->_content;
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
               local_d8,(char *)svBindings);
    pTVar8 = &term;
    TVar15 = Kernel::TermList::top(pTVar8);
    iVar6 = (*pNVar11->_vptr_Node[10])
                      (pNVar11,TVar15._inner._inner._0_8_,(ulong)(TVar15._inner._inner._8_4_ & 0xff)
                       ,1);
    leaf = (Node **)CONCAT44(extraout_var_01,iVar6);
    if (*leaf == (Node *)0x0) {
      _boundVar_1 = (Entry *)0x0;
      pEStack_120 = (Entry *)0x0;
      local_118 = (Binding *)0x0;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::items
                ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 local_140);
      Lib::iterTraits<Lib::VirtualIterator<std::pair<unsigned_int_const&,Kernel::TermList_const&>>>
                ((Lib *)&local_138,
                 (VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> *)
                 local_140);
      Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
      ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                        *)local_140);
      Lib::
      IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
      ::StlIter::StlIter((StlIter *)&subterms,
                         (IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                          *)&local_138);
      while ((char)subterms._stack != '\0') {
        BVar14._4_4_ = 0;
        BVar14.var = *(uint *)subterms._cursor;
        BVar14.term._content = (uint64_t)*subterms._end;
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
        ::insert((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                  *)&boundVar_1,BVar14);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::operator++((StlIter *)&subterms);
      }
      Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
      ~VirtualIterator(&local_138);
      while (boundVar_1 != 0) {
        BVar14 = Lib::
                 BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                 ::pop((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                        *)&boundVar_1);
        pIVar7 = createIntermediateNode(term,BVar14.var);
        *leaf = &pIVar7->super_Node;
        term._content = BVar14.term._content._content;
        TVar15 = Kernel::TermList::top(&term);
        iVar6 = (*(pIVar7->super_Node)._vptr_Node[10])
                          (pIVar7,TVar15._inner._inner._0_8_,
                           (ulong)(TVar15._inner._inner._8_4_ & 0xff),1);
        leaf = (Node **)CONCAT44(extraout_var_02,iVar6);
      }
      pNVar11 = &createLeaf(term)->super_Node;
      *leaf = pNVar11;
      Kernel::SelectedLiteral::SelectedLiteral(&local_108,&ld->super_SelectedLiteral);
      (*((Node *)&pNVar11->_vptr_Node)->_vptr_Node[9])(pNVar11,&local_108);
      ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
      Lib::
      BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
      ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                     *)&boundVar_1);
      return;
    }
    pTVar12 = &(*leaf)->_term;
    subterms._capacity = 0x40;
    subterms._stack = (TermList **)Lib::alloc(0x200);
    pSVar3 = local_110;
    subterms._end = subterms._stack + subterms._capacity;
    subterms._cursor = subterms._stack;
LAB_002cb82e:
    tt._content = pTVar8->_content;
    TVar9._content = tt._content;
    if (tt._content != pTVar12->_content) {
      bVar4 = Kernel::TermList::sameTop((TermList)pTVar12->_content,tt);
      TVar9._content = pTVar12->_content;
      tt._content = pTVar8->_content;
      if (bVar4) {
        if ((((Term *)TVar9._content)->_args[0]._content & 8) != 0) {
          TVar9._content = (uint64_t)Kernel::Term::cloneNonShared(TVar9._content);
          pTVar12->_content = TVar9._content;
        }
        uVar10 = (ulong)(*(uint *)&((Term *)TVar9._content)->field_0xc & 0xfffffff);
        pTVar12 = ((Term *)TVar9._content)->_args + uVar10;
        pTVar8 = (TermList *)
                 ((ulong)(*(uint *)(tt._content + 0xc) & 0xfffffff) * 8 + 0x28 + tt._content);
        if ((((Term *)TVar9._content)->_args[uVar10 - 1]._content & 3) != 2) {
          Lib::Stack<Kernel::TermList_*>::push
                    (&subterms,((Term *)TVar9._content)->_args + (uVar10 - 1));
          Lib::Stack<Kernel::TermList_*>::push(&subterms,pTVar8 + -1);
        }
        goto LAB_002cb82e;
      }
    }
    bVar4 = Kernel::TermList::sameTop(TVar9,tt);
    if (!bVar4) {
      TVar9._content = pTVar12->_content;
      if ((~(uint)TVar9._content & 3) == 0) {
        uVar5 = (uint)(TVar9._content >> 2);
      }
      else {
        uVar5 = pSVar3->_nextVar;
        pSVar3->_nextVar = uVar5 + 1;
        obj._4_4_ = 0;
        obj.var = uVar5;
        obj.original._content = TVar9._content;
        Lib::
        BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
        ::insert(&insert::unresolvedSplits,obj);
        pTVar12->_content = (ulong)(uVar5 * 4 + 3);
      }
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                (svBindings,uVar5,(TermList)pTVar8->_content);
    }
    if (subterms._cursor != subterms._stack) {
      pTVar8 = subterms._cursor[-1];
      ppTVar1 = subterms._cursor + -2;
      pTVar12 = subterms._cursor[-2];
      subterms._cursor = ppTVar1;
      if ((((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar12 + -1))->_vars & 3) != 2) {
        Lib::Stack<Kernel::TermList_*>::push
                  (&subterms,&((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar12 + -1))->_sort);
        Lib::Stack<Kernel::TermList_*>::push(&subterms,pTVar8 + -1);
      }
      goto LAB_002cb82e;
    }
    if (svBindings->_size != 0) {
      Lib::Stack<Kernel::TermList_*>::~Stack(&subterms);
      inode = leaf;
      goto LAB_002cb637;
    }
    ensureLeafEfficiency((Leaf **)leaf);
    pNVar11 = *leaf;
    Kernel::SelectedLiteral::SelectedLiteral
              ((SelectedLiteral *)(local_d8 + 0x18),&ld->super_SelectedLiteral);
    (*((Node *)&pNVar11->_vptr_Node)->_vptr_Node[9])(pNVar11,(SelectedLiteral *)(local_d8 + 0x18));
    Lib::Stack<Kernel::TermList_*>::~Stack(&subterms);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}